

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O3

int __thiscall BmsNoteManager::GetKeys(BmsNoteManager *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int i;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int keycnt [20];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  local_28 = (undefined1  [16])0x0;
  local_38 = (undefined1  [16])0x0;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  lVar4 = 0;
  do {
    iVar1 = BmsNoteLane::GetNoteCount(this->lanes_,true,true,false);
    *(int *)(local_68 + lVar4 * 4) = iVar1;
    lVar4 = lVar4 + 1;
    this = (BmsNoteManager *)((long)this + 0x30);
  } while (lVar4 != 0x14);
  iVar1 = 0x12;
  if ((local_28._8_4_ == 0) && (iVar1 = 0xe, local_28._4_4_ == 0 && local_28._0_4_ == 0)) {
    auVar5._0_4_ = -(uint)(local_38._0_4_ == 0);
    auVar5._4_4_ = -(uint)(local_38._4_4_ == 0);
    auVar5._8_4_ = -(uint)(local_38._8_4_ == 0);
    auVar5._12_4_ = -(uint)(local_38._12_4_ == 0);
    iVar2 = movmskps(0xe,auVar5);
    iVar1 = 10;
    if ((iVar2 == 0xf) && ((local_48._12_4_ == 0 && (iVar1 = 9, local_48._0_4_ == 0)))) {
      iVar1 = 7;
      if (local_58._12_4_ == 0 && local_58._8_4_ == 0) {
        auVar6._0_4_ = -(uint)(local_68._8_4_ == 0);
        auVar6._4_4_ = -(uint)(local_68._12_4_ == 0);
        auVar6._8_4_ = -(uint)(local_58._0_4_ == 0);
        auVar6._12_4_ = -(uint)(local_58._4_4_ == 0);
        iVar1 = movmskps(0,auVar6);
        bVar3 = iVar1 != 0xf || local_68._4_4_ != 0;
        iVar1 = (uint)bVar3 + (uint)bVar3 * 4;
      }
    }
  }
  return iVar1;
}

Assistant:

int BmsNoteManager::GetKeys() {
	int keycnt[_MAX_NOTE_LANE] = { 0, };
	for (int i = 0; i < _MAX_NOTE_LANE; i++)
		keycnt[i] = lanes_[i].GetNoteCount();
	
	// check DP first
	if (keycnt[18])
		return 18;
	else if (keycnt[16] || keycnt[17])
		return 14;
	else if (keycnt[15] || keycnt[14] || keycnt[13] || keycnt[12] || keycnt[11])
		return 10;
	else if (keycnt[8])
		return 9;
	else if (keycnt[6] || keycnt[7])
		return 7;
	else if (keycnt[5] || keycnt[4] || keycnt[3] || keycnt[2] || keycnt[1])
		return 5;

	// unknown ..?
	return 0;
}